

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

Emb_Obj_t * Emb_ManRandomVertex(Emb_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Emb_Obj_t *pEStack_18;
  int iNode;
  Emb_Obj_t *pPivot;
  Emb_Man_t *p_local;
  
  do {
    uVar1 = Gia_ManRandom(0);
    uVar2 = Gia_ManObjNum(p->pGia);
    uVar2 = (uVar1 * 0x38f) % uVar2;
    pGVar4 = Gia_ManObj(p->pGia,uVar2);
    if (pGVar4->Value == 0xffffffff) {
      pEStack_18 = (Emb_Obj_t *)0x0;
    }
    else {
      pGVar4 = Gia_ManObj(p->pGia,uVar2);
      pEStack_18 = Emb_ManObj(p,pGVar4->Value);
    }
    bVar5 = true;
    if (pEStack_18 != (Emb_Obj_t *)0x0) {
      iVar3 = Emb_ObjIsNode(pEStack_18);
      bVar5 = iVar3 == 0;
    }
  } while (bVar5);
  return pEStack_18;
}

Assistant:

Emb_Obj_t * Emb_ManRandomVertex( Emb_Man_t * p )
{
    Emb_Obj_t * pPivot;
    do {
        int iNode = (911 * Gia_ManRandom(0)) % Gia_ManObjNum(p->pGia);
        if ( ~Gia_ManObj(p->pGia, iNode)->Value )
            pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        else
            pPivot = NULL;
    }
    while ( pPivot == NULL || !Emb_ObjIsNode(pPivot) );
    return pPivot;
}